

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcpnint.h
# Opt level: O0

CTcPrsNode * __thiscall CTPNUnaryBase::adjust_for_dyn(CTPNUnaryBase *this,tcpn_dyncomp_info *info)

{
  int iVar1;
  _func_int **pp_Var2;
  long in_RSI;
  CTcPrsNode *in_RDI;
  
  if (*(int *)(in_RSI + 4) != 0) {
    iVar1 = (*(in_RDI->super_CTcPrsNodeBase)._vptr_CTcPrsNodeBase[0x1b])();
    if (iVar1 != 0) {
      err_throw(0);
    }
  }
  pp_Var2 = in_RDI[1].super_CTcPrsNodeBase._vptr_CTcPrsNodeBase;
  pp_Var2 = (_func_int **)(**(code **)(*pp_Var2 + 0x88))(pp_Var2,in_RSI);
  in_RDI[1].super_CTcPrsNodeBase._vptr_CTcPrsNodeBase = pp_Var2;
  return in_RDI;
}

Assistant:

class CTcPrsNode *adjust_for_dyn(const tcpn_dyncomp_info *info)
    {
        /* 
         *   if this expression has side effects, don't allow it to be
         *   evaluated speculatively 
         */
        if (info->speculative && has_side_effects())
            err_throw(VMERR_BAD_SPEC_EVAL);
        
        /* adjust my subexpression */
        sub_ = sub_->adjust_for_dyn(info);

        /* return myself otherwise unchanged */
        return this;
    }